

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacros
          (string *out,MacroExpanderVector *macroExpanders,int version)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ExpandMacroResult EVar5;
  size_type sVar6;
  int iVar7;
  bool bVar8;
  string macroNamespace;
  string result;
  string macroName;
  string local_b8;
  undefined1 *local_98;
  string local_90;
  ExpandMacroResult local_70;
  int local_6c;
  string local_68;
  string *local_48;
  MacroExpanderVector *local_40;
  pointer local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  iVar7 = 0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  sVar2 = out->_M_string_length;
  bVar8 = sVar2 == 0;
  local_6c = version;
  local_48 = out;
  local_40 = macroExpanders;
  if (!bVar8) {
    local_38 = (out->_M_dataplus)._M_p;
    sVar6 = 0;
    iVar7 = 0;
    do {
      cVar1 = local_38[sVar6];
      if (iVar7 == 2) {
        if (cVar1 == '}') {
          EVar5 = ExpandMacro(&local_90,&local_b8,&local_68,local_40,local_6c);
          bVar3 = EVar5 == Ok;
          if (bVar3) {
            iVar7 = 0;
            local_b8._M_string_length = 0;
            *local_b8._M_dataplus._M_p = '\0';
            local_68._M_string_length = 0;
            *local_68._M_dataplus._M_p = '\0';
          }
          else {
            iVar7 = 2;
            local_70 = EVar5;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_68);
          iVar7 = 2;
LAB_0032dc30:
          bVar3 = true;
        }
      }
      else if (iVar7 == 1) {
        if (cVar1 != '{') {
          std::__cxx11::string::push_back((char)&local_b8);
          local_98 = (undefined1 *)&local_b8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                *)&local_98,(char **)(anonymous_namespace)::ValidPrefixes);
          if ((((bVar3) ||
               (bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                        ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                      *)&local_98,
                                     (char **)((anonymous_namespace)::ValidPrefixes + 8)), bVar3))
              || (bVar3 = __gnu_cxx::__ops::
                          _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                          ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                        *)&local_98,
                                       (char **)((anonymous_namespace)::ValidPrefixes + 0x10)),
                 bVar3)) ||
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                    *)&local_98,
                                   (char **)((anonymous_namespace)::ValidPrefixes + 0x18)), bVar3))
          {
            iVar7 = 1;
          }
          else {
            std::__cxx11::string::push_back((char)&local_90);
            std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8._M_dataplus._M_p);
            local_b8._M_string_length = 0;
            *local_b8._M_dataplus._M_p = '\0';
            iVar7 = 0;
          }
          goto LAB_0032dc30;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        iVar7 = 2;
        bVar3 = true;
        if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0))
           && ((iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0 &&
               (iVar4 = std::__cxx11::string::compare((char *)&local_b8), iVar4 != 0)))) {
          std::__cxx11::string::push_back((char)&local_90);
          std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8._M_dataplus._M_p);
          std::__cxx11::string::push_back((char)&local_90);
          local_b8._M_string_length = 0;
          *local_b8._M_dataplus._M_p = '\0';
          iVar7 = 0;
        }
      }
      else {
        iVar7 = 1;
        bVar3 = true;
        if (cVar1 != '$') {
          iVar7 = 0;
          std::__cxx11::string::push_back((char)&local_90);
        }
      }
      if (!bVar3) break;
      sVar6 = sVar6 + 1;
      bVar8 = sVar2 == sVar6;
    } while (!bVar8);
  }
  EVar5 = local_70;
  if (bVar8) {
    if (iVar7 == 2) {
      EVar5 = Error;
    }
    else {
      if (iVar7 == 1) {
        std::__cxx11::string::push_back((char)&local_90);
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8._M_dataplus._M_p);
      }
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_90);
      EVar5 = Ok;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return EVar5;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacros(
  std::string& out, MacroExpanderVector const& macroExpanders, int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}